

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

bool __thiscall test_case::eval_grad(test_case *this,ggml_backend_t backend,char *op_name)

{
  float fVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ggml_cgraph *pgVar6;
  undefined4 extraout_var;
  int *piVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  undefined4 extraout_var_00;
  int *piVar11;
  ggml_tensor *t;
  size_type __new_size;
  ggml_tensor *t_00;
  undefined8 uVar12;
  FILE *pFVar13;
  char *__format;
  size_t nvalid;
  size_t i;
  const_iterator __begin3;
  pointer pfVar14;
  size_type sVar15;
  long lVar16;
  bool bVar17;
  float extraout_XMM0_Da;
  float fVar18;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar19 [16];
  ggml_context_ptr ctx;
  double local_118;
  float fd;
  float fu;
  vector<float,_std::allocator<float>_> ga;
  float fdh;
  float fuh;
  float xid;
  float xidh;
  float xiuh;
  float xiu;
  char *local_b0;
  ggml_backend_buffer_ptr buf;
  vector<float,_std::allocator<float>_> gn;
  vector<float,_std::allocator<float>_> expect;
  vector<float,_std::allocator<float>_> x0;
  
  this->mode = MODE_GRAD;
  (*this->_vptr_test_case[10])(&expect,this);
  ggml_tensor_overhead();
  ggml_graph_overhead_custom(0x800,1);
  ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)ggml_init();
  if ((tuple<ggml_context_*,_ggml_context_deleter>)
      ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ggml_context_*,_false>)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
               ,0x2f7,"GGML_ASSERT(%s) failed","ctx");
  }
  pgVar6 = (ggml_cgraph *)
           ggml_new_graph_custom
                     (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0x800,1);
  this->gf = pgVar6;
  pgVar6 = (ggml_cgraph *)
           ggml_new_graph_custom
                     (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0x800,1);
  this->gb = pgVar6;
  iVar4 = (*this->_vptr_test_case[4])
                    (this,ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
  piVar11 = (int *)CONCAT44(extraout_var,iVar4);
  if (op_name == (char *)0x0) {
    iVar4 = piVar11[0x14];
joined_r0x0011b781:
    bVar2 = true;
    if (iVar4 == 0x51) goto LAB_0011ba8a;
    (*this->_vptr_test_case[2])(&ga,this,piVar11);
    pfVar14 = ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start;
    (*this->_vptr_test_case[3])(&gn,this);
    printf("  %s(%s): ",pfVar14,
           gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start);
    std::__cxx11::string::~string((string *)&gn);
    std::__cxx11::string::~string((string *)&ga);
    fflush(_stdout);
    if (*piVar11 == 0) {
      piVar7 = (int *)ggml_get_first_tensor
                                (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      bVar2 = false;
      for (; piVar7 != (int *)0x0;
          piVar7 = (int *)ggml_get_next_tensor
                                    (ctx._M_t.
                                     super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                     super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                     super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                     piVar7)) {
        cVar3 = ggml_backend_supports_op(backend,piVar7);
        if (cVar3 == '\0') {
          uVar10 = ggml_backend_name(backend);
          printf("not supported [%s] ",uVar10);
          if (!bVar2) goto LAB_0011b8de;
          goto LAB_0011ba7f;
        }
        if (((*(byte *)(piVar7 + 0x25) & 4) != 0) && (bVar2 = true, *piVar7 != 0))
        goto LAB_0011ba67;
      }
      if (!bVar2) {
LAB_0011b8de:
        (*this->_vptr_test_case[2])(&ga,this,piVar11);
        printf("not supported [%s] \n",
               ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start);
        std::__cxx11::string::~string((string *)&ga);
        goto LAB_0011ba7f;
      }
      lVar8 = ggml_get_first_tensor
                        (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      lVar16 = 0;
      for (; lVar8 != 0;
          lVar8 = ggml_get_next_tensor
                            (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                             .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar8)) {
        if ((*(byte *)(lVar8 + 0x94) & 4) != 0) {
          lVar9 = ggml_nelements(lVar8);
          lVar16 = lVar16 + lVar9;
        }
      }
      iVar4 = (*this->_vptr_test_case[9])(this);
      if (lVar16 <= CONCAT44(extraout_var_00,iVar4)) {
        cVar3 = ggml_is_scalar(piVar11);
        if (cVar3 == '\0') {
          piVar11 = (int *)ggml_sum(ctx._M_t.
                                    super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                    piVar11);
          ggml_set_name(piVar11,"sum_of_out");
        }
        ggml_set_loss(piVar11);
        ggml_build_forward_expand(this->gf,piVar11);
        ggml_graph_cpy(this->gf,this->gb);
        ggml_build_backward_expand
                  (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                   super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                   super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                   ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                   super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                   super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,this->gb,0);
        if ((((long)expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != 4) ||
            (*expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != 0.0)) ||
           (NAN(*expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start))) {
          iVar4 = ggml_graph_n_nodes(this->gb);
          iVar5 = ggml_graph_n_nodes(this->gf);
          if (iVar4 <= iVar5) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                       ,0x33c,"GGML_ASSERT(%s) failed",
                       "ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf)");
          }
          for (lVar8 = ggml_get_first_tensor
                                 (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>
                                  ._M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                  .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
              lVar8 != 0;
              lVar8 = ggml_get_next_tensor
                                (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,lVar8)) {
            if (((*(byte *)(lVar8 + 0x94) & 4) != 0) &&
               (lVar16 = ggml_graph_get_grad(this->gb,lVar8), *(int *)(lVar16 + 0x50) == 0)) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                         ,0x33e,"GGML_ASSERT(%s) failed",
                         "!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE"
                        );
            }
          }
        }
        for (piVar7 = (int *)ggml_get_first_tensor
                                       (ctx._M_t.
                                        super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                        .super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
            piVar7 != (int *)0x0;
            piVar7 = (int *)ggml_get_next_tensor
                                      (ctx._M_t.
                                       super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,
                                       piVar7)) {
          cVar3 = ggml_backend_supports_op(backend,piVar7);
          if (cVar3 == '\0') {
            piVar7 = (int *)ggml_backend_name(backend);
            __format = "not supported [%s] ";
            goto LAB_0011ba78;
          }
          if (((*(byte *)(piVar7 + 0x25) & 4) != 0) && (*piVar7 != 0)) goto LAB_0011ba67;
        }
        buf._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
        super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
        super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl =
             (__uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>)
             ggml_backend_alloc_ctx_tensors
                       (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,backend);
        if ((tuple<ggml_backend_buffer_*,_ggml_backend_buffer_deleter>)
            buf._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
            super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
            super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl ==
            (_Head_base<0UL,_ggml_backend_buffer_*,_false>)0x0) {
          uVar10 = ggml_backend_name(backend);
          bVar2 = false;
          printf("failed to allocate tensors [%s] ",uVar10);
        }
        else {
          (*this->_vptr_test_case[0xb])
                    (this,ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
          ggml_graph_reset(this->gb);
          iVar4 = ggml_backend_graph_compute(backend,this->gf);
          pFVar13 = _stderr;
          if (iVar4 == 0) {
            iVar4 = ggml_backend_graph_compute(backend,this->gb);
            pFVar13 = _stderr;
            if (iVar4 == 0) {
              t = (ggml_tensor *)
                  ggml_get_first_tensor
                            (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
                             .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                             super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
              bVar2 = true;
              local_b0 = "ggml_is_scalar(out)";
              for (; t != (ggml_tensor *)0x0;
                  t = (ggml_tensor *)
                      ggml_get_next_tensor
                                (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,t)) {
                if ((t->flags & 4) != 0) {
                  uVar10 = ggml_backend_name(backend);
                  __new_size = ggml_nelements(t);
                  ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  t_00 = (ggml_tensor *)ggml_graph_get_grad(this->gb,t);
                  if (t_00 == (ggml_tensor *)0x0) {
                    std::vector<float,_std::allocator<float>_>::resize(&ga,__new_size);
                  }
                  else {
                    tensor_to_float((vector<float,_std::allocator<float>_> *)
                                    &gn.super__Vector_base<float,_std::allocator<float>_>,t_00);
                    std::vector<float,_std::allocator<float>_>::_M_move_assign
                              (&ga,&gn.super__Vector_base<float,_std::allocator<float>_>);
                    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                              (&gn.super__Vector_base<float,_std::allocator<float>_>);
                  }
                  local_118 = (double)__new_size;
                  if ((long)__new_size < 1) {
                    local_118 = 0.0;
                  }
                  for (sVar15 = 0; local_118 != (double)sVar15; sVar15 = sVar15 + 1) {
                    if (0x7f7fffff <
                        (uint)ABS(ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start[sVar15])) {
                      uVar12 = ggml_op_desc(t);
                      printf("[%s] nonfinite gradient at index %ld (%s=%f) ",
                             (double)ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[sVar15],uVar12,sVar15,uVar10);
                      bVar2 = false;
                      goto LAB_0011c117;
                    }
                  }
                  if (!bVar2) {
LAB_0011c117:
                    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                              (&ga.super__Vector_base<float,_std::allocator<float>_>);
                    break;
                  }
                  std::vector<float,_std::allocator<float>_>::vector
                            ((vector<float,_std::allocator<float>_> *)
                             &gn.super__Vector_base<float,_std::allocator<float>_>,__new_size,
                             (allocator_type *)&x0);
                  if ((long)ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)ga.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start !=
                      (long)gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start) {
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                               ,0x386,"GGML_ASSERT(%s) failed","ga.size() == gn.size()");
                  }
                  tensor_to_float(&x0,t);
                  cVar3 = ggml_is_scalar(piVar11);
                  if (cVar3 == '\0') {
                    uVar10 = 0x389;
LAB_0011c26a:
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                               ,uVar10,"GGML_ASSERT(%s) failed",local_b0);
                  }
                  if (*piVar11 != 0) {
                    uVar10 = 0x38a;
                    local_b0 = "out->type == GGML_TYPE_F32";
                    goto LAB_0011c26a;
                  }
                  (*this->_vptr_test_case[7])(this);
                  lVar8 = 0;
                  while (bVar17 = local_118 != 0.0, local_118 = (double)((long)local_118 - 1),
                        bVar17) {
                    xiu = *(float *)((long)x0.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar8) +
                          extraout_XMM0_Da;
                    xiuh = extraout_XMM0_Da * 0.5 +
                           *(float *)((long)x0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar8);
                    xidh = extraout_XMM0_Da * -0.5 +
                           *(float *)((long)x0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar8);
                    xid = *(float *)((long)x0.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar8) -
                          extraout_XMM0_Da;
                    ggml_backend_tensor_set(t,&xiu,lVar8,4);
                    iVar4 = ggml_backend_graph_compute(backend,this->gf);
                    pFVar13 = _stderr;
                    if (iVar4 != 0) {
                      uVar10 = ggml_status_to_string(iVar4);
LAB_0011c068:
                      fprintf(pFVar13,"%s: ggml_backend_graph_compute failed. status=%s \n",
                              "eval_grad",uVar10);
                      iVar4 = 1;
                      goto LAB_0011c089;
                    }
                    uVar10 = ggml_nbytes(piVar11);
                    ggml_backend_tensor_get(piVar11,&fu,0,uVar10);
                    ggml_backend_tensor_set(t,&xid,lVar8,4);
                    iVar4 = ggml_backend_graph_compute(backend,this->gf);
                    pFVar13 = _stderr;
                    if (iVar4 != 0) {
                      uVar10 = ggml_status_to_string(iVar4);
                      goto LAB_0011c068;
                    }
                    uVar10 = ggml_nbytes(piVar11);
                    ggml_backend_tensor_get(piVar11,&fd,0,uVar10);
                    iVar4 = (*this->_vptr_test_case[8])(this);
                    if ((char)iVar4 != '\0') {
                      ggml_backend_tensor_set(t,&xiuh,lVar8,4);
                      iVar4 = ggml_backend_graph_compute(backend,this->gf);
                      pFVar13 = _stderr;
                      if (iVar4 == 0) {
                        uVar10 = ggml_nbytes(piVar11);
                        ggml_backend_tensor_get(piVar11,&fuh,0,uVar10);
                        ggml_backend_tensor_set(t,&xidh,lVar8,4);
                        iVar4 = ggml_backend_graph_compute(backend,this->gf);
                        pFVar13 = _stderr;
                        if (iVar4 == 0) {
                          uVar10 = ggml_nbytes(piVar11);
                          ggml_backend_tensor_get(piVar11,&fdh,0,uVar10);
                          fVar18 = ((fuh * 8.0 + fd) - (fdh * 8.0 + fu)) / (extraout_XMM0_Da * 6.0);
                          goto LAB_0011be9e;
                        }
                        uVar10 = ggml_status_to_string(iVar4);
                      }
                      else {
                        uVar10 = ggml_status_to_string(iVar4);
                      }
                      goto LAB_0011c068;
                    }
                    fVar18 = (fu - fd) / (extraout_XMM0_Da + extraout_XMM0_Da);
LAB_0011be9e:
                    pfVar14 = x0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    *(float *)((long)gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8) = fVar18;
                    uVar10 = ggml_nbytes(t);
                    ggml_backend_tensor_set(t,pfVar14,0,uVar10);
                    lVar8 = lVar8 + 4;
                  }
                  local_118 = 0.0;
                  lVar8 = 0;
                  for (lVar16 = 0;
                      lVar16 != (long)gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2; lVar16 = lVar16 + 1) {
                    pfVar14 = expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if (expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start ==
                        expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                      fVar18 = gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar16];
                    }
                    else {
                      do {
                        if (pfVar14 ==
                            expect.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish) goto LAB_0011bf8c;
                        fVar18 = gn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar16];
                        fVar1 = *pfVar14;
                        pfVar14 = pfVar14 + 1;
                      } while (0.001 <= ABS(fVar18 - fVar1));
                    }
                    local_118 = local_118 +
                                (double)ABS((fVar18 - ga.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar16])
                                            / (fVar18 + ga.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar16]))
                    ;
                    lVar8 = lVar8 + 1;
LAB_0011bf8c:
                  }
                  auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
                  auVar19._0_8_ = lVar8;
                  auVar19._12_4_ = 0x45300000;
                  (*this->_vptr_test_case[6])(this);
                  local_118 = local_118 /
                              ((auVar19._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
                  iVar4 = 0;
                  if (extraout_XMM0_Qa < local_118) {
                    uVar10 = ggml_op_desc(t);
                    (*this->_vptr_test_case[6])(this);
                    printf("[%s] MAA = %.9f > %.9f ",local_118,extraout_XMM0_Qa_00,uVar10);
                    bVar2 = false;
                    iVar4 = 0xe;
                  }
LAB_0011c089:
                  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                            (&x0.super__Vector_base<float,_std::allocator<float>_>);
                  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                            (&gn.super__Vector_base<float,_std::allocator<float>_>);
                  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                            (&ga.super__Vector_base<float,_std::allocator<float>_>);
                  if (iVar4 != 0) {
                    if (iVar4 != 0xe) {
                      bVar2 = false;
                      goto LAB_0011c1bf;
                    }
                    break;
                  }
                }
              }
              if (bVar2) {
                puts("\x1b[1;32mOK\x1b[0m");
                bVar2 = true;
              }
              else {
                bVar2 = false;
                printf("compare failed ");
                puts("\x1b[1;31mFAIL\x1b[0m");
              }
              goto LAB_0011c1bf;
            }
            uVar10 = ggml_status_to_string(iVar4);
          }
          else {
            uVar10 = ggml_status_to_string(iVar4);
          }
          bVar2 = false;
          fprintf(pFVar13,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_grad",uVar10);
        }
LAB_0011c1bf:
        std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr(&buf);
        goto LAB_0011ba8a;
      }
      puts("skipping large tensors for speed ");
    }
    else {
      printf("not supported [%s->type != FP32]\n",piVar11 + 0x40);
    }
  }
  else {
    (*this->_vptr_test_case[2])(&ga,this,piVar11);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ga
                            ,op_name);
    if (!bVar2) {
      iVar4 = piVar11[0x14];
      std::__cxx11::string::~string((string *)&ga);
      goto joined_r0x0011b781;
    }
    std::__cxx11::string::~string((string *)&ga);
  }
  goto LAB_0011ba87;
LAB_0011ba67:
  piVar7 = piVar7 + 0x40;
  __format = "not supported [%s->type != FP32] ";
LAB_0011ba78:
  printf(__format,piVar7);
LAB_0011ba7f:
  putchar(10);
LAB_0011ba87:
  bVar2 = true;
LAB_0011ba8a:
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&ctx);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&expect.super__Vector_base<float,_std::allocator<float>_>);
  return bVar2;
}

Assistant:

bool eval_grad(ggml_backend_t backend, const char * op_name) {
        mode = MODE_GRAD;
        const std::vector<float> expect = grad_expect();

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + 2*ggml_graph_overhead_custom(GGML_DEFAULT_GRAPH_SIZE, true),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        gf = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);
        gb = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);

        ggml_tensor * out = build_graph(ctx.get());

        if ((op_name != nullptr && op_desc(out) != op_name) || out->op == GGML_OP_OPT_STEP_ADAMW) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        if (out->type != GGML_TYPE_F32) {
            printf("not supported [%s->type != FP32]\n", out->name);
            return true;
        }

        // check if the backend supports the ops
        bool supported = true;
        bool any_params = false;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM)) {
                any_params = true;
                if (t->type != GGML_TYPE_F32) {
                    printf("not supported [%s->type != FP32] ", t->name);
                    supported = false;
                    break;
                }
            }
        }
        if (!any_params) {
            printf("not supported [%s] \n", op_desc(out).c_str());
            supported = false;
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        int64_t ngrads = 0;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (t->flags & GGML_TENSOR_FLAG_PARAM) {
                ngrads += ggml_nelements(t);
            }
        }
        if (ngrads > grad_nmax()) {
            printf("skipping large tensors for speed \n");
            return true;
        }


        if (!ggml_is_scalar(out)) {
            out = ggml_sum(ctx.get(), out);
            ggml_set_name(out, "sum_of_out");
        }
        ggml_set_loss(out);

        ggml_build_forward_expand(gf, out);
        ggml_graph_cpy(gf, gb);
        ggml_build_backward_expand(ctx.get(), ctx.get(), gb, false);
        if (expect.size() != 1 || expect[0] != 0.0f) {
            GGML_ASSERT(ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf));
            for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
                GGML_ASSERT(!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE);
            }
        }

        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM) && t->type != GGML_TYPE_F32) {
                printf("not supported [%s->type != FP32] ", t->name);
                supported = false;
                break;
            }
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr
        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend));
            return false;
        }

        initialize_tensors(ctx.get()); // Randomizes all tensors (including gradients).
        ggml_graph_reset(gb);    // Sets gradients to 1 if loss, 0 otherwise.

        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }
        status = ggml_backend_graph_compute(backend, gb);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        bool ok = true;
        for (struct ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != nullptr; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!(t->flags & GGML_TENSOR_FLAG_PARAM)) {
                continue;
            }

            const char * bn = ggml_backend_name(backend);
            const int64_t ne = ggml_nelements(t);

            std::vector<float> ga;
            struct ggml_tensor * grad = ggml_graph_get_grad(gb, t);
            if (grad) {
                ga = tensor_to_float(grad);
            } else {
                ga.resize(ne); // default value is 0.0f
            }

            for (int64_t i = 0; i < ne; ++i) { // gradient algebraic
                // check for nans
                if (!std::isfinite(ga[i])) {
                    printf("[%s] nonfinite gradient at index %" PRId64 " (%s=%f) ", ggml_op_desc(t), i, bn, ga[i]);
                    ok = false;
                    break;
                }
            }
            if (!ok) {
                break;
            }

            std::vector<float> gn(ne); // gradient numeric
            GGML_ASSERT(ga.size() == gn.size());

            std::vector<float> x0 = tensor_to_float(t); // original t data
            GGML_ASSERT(ggml_is_scalar(out));
            GGML_ASSERT(out->type == GGML_TYPE_F32);

            const float eps = grad_eps();
            for (int64_t i = 0; i < ne; ++i) {
                const float xiu  = x0[i] + 1.0f*eps; // x, index i, up
                const float xiuh = x0[i] + 0.5f*eps; // x, index i, up half
                const float xidh = x0[i] - 0.5f*eps; // x, index i, down half
                const float xid  = x0[i] - 1.0f*eps; // x, index i, down

                float fu, fuh, fdh, fd; // output values for xiu, xiuh, xid, xidh

                ggml_backend_tensor_set(t, &xiu, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fu, 0, ggml_nbytes(out));

                ggml_backend_tensor_set(t, &xid, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fd, 0, ggml_nbytes(out));

                if (grad_precise()) {
                    ggml_backend_tensor_set(t, &xiuh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fuh, 0, ggml_nbytes(out));

                    ggml_backend_tensor_set(t, &xidh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fdh, 0, ggml_nbytes(out));

                    gn[i] = (8.0*(double)fuh + (double)fd - (8.0*(double)fdh + (double)fu)) / (6.0*(double)eps);
                } else {
                    gn[i] = (fu - fd) / (2.0f*eps);
                }

                ggml_backend_tensor_set(t, x0.data(), 0, ggml_nbytes(t));
            }

            const double err = mean_abs_asymm(gn.data(), ga.data(), gn.size(), expect);
            if (err > max_maa_err()) {
                printf("[%s] MAA = %.9f > %.9f ", ggml_op_desc(t), err, max_maa_err());
                ok = false;
                break;
            }
            if (!ok) {
                break;
            }
        }

        if (!ok) {
            printf("compare failed ");
        }

        if (ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }